

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O2

void pg::set_in_WRAP(WorkerP *w,Task *__dq_head,TD_set_in *t)

{
  set_in_CALL(w,__dq_head,(t->d).args.arg_1,(t->d).args.arg_2);
  return;
}

Assistant:

VOID_TASK_2(set_in, int, begin, int, count)
{
    // some cut-off point...
    if (count <= 64) {
        for (int i=0; i<count; i++) {
            int n = begin+i;
            if (done[n] != 3) {
                int s = str[n];
                if (s != -1 and !halt[s]) {
                    // atomically set first_in[s] to n, and return the previous value
                    next_in[n] = __sync_lock_test_and_set(first_in+s, n);
                }
            }
        }
    } else {
        SPAWN(set_in, begin+count/2, count-count/2);
        CALL(set_in, begin, count/2);
        SYNC(set_in);
    }
}